

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

bool __thiscall
iDynTree::KinDynComputations::getCentroidalAverageVelocity
          (KinDynComputations *this,Span<double,__1L> vel)

{
  long lVar1;
  pointer __dest;
  Index size;
  SrcEvaluatorType srcEvaluator;
  long lVar2;
  long lVar3;
  ulong uVar4;
  Matrix<double,_6,_1,_0,_6,_1> ret;
  _func_int **local_98;
  KinDynComputationsPrivateAttributes *pKStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  KinDynComputations local_68;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  __dest = vel.storage_.data_;
  if (vel.storage_.super_extent_type<_1L>.size_.size_ == 6) {
    getCentroidalAverageVelocity(&local_68);
    local_98 = local_68._vptr_KinDynComputations;
    pKStack_90 = local_68.pimpl;
    local_88 = local_58;
    local_80 = local_50;
    uStack_78 = uStack_48;
    local_70 = local_40;
    uVar4 = 6;
    if ((((undefined1  [16])vel.storage_ & (undefined1  [16])0x7) == (undefined1  [16])0x0) &&
       (uVar4 = (ulong)((uint)((ulong)__dest >> 3) & 1), 5 < uVar4)) {
      uVar4 = 6;
    }
    lVar2 = 6 - uVar4;
    if (uVar4 != 0) {
      memcpy(__dest,&local_98,uVar4 * 8);
    }
    lVar3 = (lVar2 - (lVar2 >> 0x3f) & 0xfffffffffffffffeU) + uVar4;
    if (1 < lVar2) {
      lVar1 = uVar4 + 2;
      if ((long)(uVar4 + 2) < lVar3) {
        lVar1 = lVar3;
      }
      memcpy(__dest + uVar4,&local_98 + uVar4,(~uVar4 + lVar1 & 0xfffffffffffffffe) * 8 + 0x10);
    }
    if (lVar3 < 6) {
      memcpy(__dest + (lVar2 / 2) * 2 + uVar4,&local_98 + (lVar2 / 2) * 2 + uVar4,(6 - lVar3) * 8);
    }
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getCentroidalAverageVelocity","Wrong size in input vel");
  }
  return vel.storage_.super_extent_type<_1L>.size_.size_ == 6;
}

Assistant:

bool KinDynComputations::getCentroidalAverageVelocity(Span<double> vel)
{
    constexpr int expected_spatial_velocity_size = 6;
    bool ok = vel.size() == expected_spatial_velocity_size;
    if( !ok )
    {
        reportError("KinDynComputations","getCentroidalAverageVelocity","Wrong size in input vel");
        return false;
    }

    toEigen(vel) = toEigen(getCentroidalAverageVelocity());

    return true;
}